

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

void double_conversion::FillDigits32(uint32_t number,Vector<char> buffer,int *length)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  int *in_RCX;
  uint uVar4;
  uint in_EDI;
  char tmp;
  int j;
  int i;
  int digit;
  int number_length;
  int local_30;
  int local_2c;
  int local_24;
  uint local_14;
  Vector<char> local_10;
  
  local_24 = 0;
  local_14 = in_EDI;
  while (local_14 != 0) {
    uVar4 = local_14 % 10;
    local_14 = local_14 / 10;
    pcVar3 = Vector<char>::operator[](&local_10,*in_RCX + local_24);
    *pcVar3 = (char)uVar4 + '0';
    local_24 = local_24 + 1;
  }
  local_30 = *in_RCX + local_24;
  for (local_2c = *in_RCX; local_30 = local_30 + -1, local_2c < local_30; local_2c = local_2c + 1) {
    pcVar3 = Vector<char>::operator[](&local_10,local_2c);
    cVar1 = *pcVar3;
    pcVar3 = Vector<char>::operator[](&local_10,local_30);
    cVar2 = *pcVar3;
    pcVar3 = Vector<char>::operator[](&local_10,local_2c);
    *pcVar3 = cVar2;
    pcVar3 = Vector<char>::operator[](&local_10,local_30);
    *pcVar3 = cVar1;
  }
  *in_RCX = local_24 + *in_RCX;
  return;
}

Assistant:

static void FillDigits32(uint32_t number, Vector<char> buffer, int* length) {
  int number_length = 0;
  // We fill the digits in reverse order and exchange them afterwards.
  while (number != 0) {
    int digit = number % 10;
    number /= 10;
    buffer[(*length) + number_length] = static_cast<char>('0' + digit);
    number_length++;
  }
  // Exchange the digits.
  int i = *length;
  int j = *length + number_length - 1;
  while (i < j) {
    char tmp = buffer[i];
    buffer[i] = buffer[j];
    buffer[j] = tmp;
    i++;
    j--;
  }
  *length += number_length;
}